

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<char_const(&)[22],std::__cxx11::string_const&>
                   (string *__return_storage_ptr__,char (*a) [22],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_48;
  size_type local_30;
  pointer local_28;
  undefined8 local_20;
  
  local_48.first._M_len = strlen(*a);
  local_48.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_28 = (b->_M_dataplus)._M_p;
  local_30 = b->_M_string_length;
  local_20 = 0;
  views._M_len = 2;
  views._M_array = &local_48;
  local_48.first._M_str = *a;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}